

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

vector_s<int,_10UL> * __thiscall
estl::vector_s<int,_10UL>::operator=(vector_s<int,_10UL> *this,initializer_list<int> ilist)

{
  pointer pvVar1;
  size_type sVar2;
  long lVar3;
  int *first;
  
  first = ilist._M_array;
  sVar2 = vector_s<int,10ul>::check_range<int_const*>
                    ((vector_s<int,10ul> *)this,first,first + ilist._M_len);
  pvVar1 = this->data_ptr_;
  for (lVar3 = 0; ilist._M_len << 2 != lVar3; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)pvVar1 + lVar3) = *(undefined4 *)((long)first + lVar3);
  }
  this->size_ = sVar2;
  return this;
}

Assistant:

vector_s& operator=(std::initializer_list<T> ilist)
    {
        auto it = ilist.begin();
        const auto end = ilist.end();
        const auto diff = check_range(it, end);
        size_type i = 0u;
        for (; it != end; ++it, ++i) {
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(*it); // TODO: Is it OK to move here! Elements are already copied into initializer_list?
        }
        size_ = diff;
        return *this;
    }